

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRHeadTrackingNode.cpp
# Opt level: O3

VRDisplayNode *
MinVR::VRHeadTrackingNode::create(VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  VRAnyCoreType VVar4;
  float *pfVar5;
  ostream *poVar6;
  VRHeadTrackingNode *this;
  VRMatrix4 M1;
  VRVector3 z;
  VRVector3 x;
  VRVector3 eye;
  VRMatrix4 M2;
  VRVector3 y;
  string trackingEvent;
  VRMatrix4 lookAtMatrix;
  VRMatrix4 headMatrix;
  VRVector3 center;
  VRVector3 up;
  undefined1 local_3e8 [72];
  float local_3a0;
  float local_39c;
  float local_398;
  float local_394;
  float local_390;
  float local_38c;
  VRVector3 local_388;
  VRVector3 local_370;
  VRVector3 local_358;
  string local_340;
  string local_320;
  undefined1 local_300 [72];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  VRVector3 local_298;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  undefined1 local_180 [72];
  undefined1 local_138 [72];
  VRVector3 local_f0;
  VRVector3 local_d8;
  VRMatrix4 local_c0;
  VRMatrix4 local_78;
  
  local_138._0_8_ = local_138 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"HeadTrackingEvent","");
  pcVar1 = (nameSpace->_M_dataplus)._M_p;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar1,pcVar1 + nameSpace->_M_string_length);
  VVar4 = VRDataIndex::getValue(config,(string *)local_138,&local_1c0,true);
  (*(VVar4.datum)->_vptr_VRDatum[2])(&local_1a0,VVar4.datum);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  VRMatrix4::VRMatrix4((VRMatrix4 *)local_138);
  pcVar1 = local_3e8 + 0x10;
  local_3e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"HeadMatrix","");
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar2,pcVar2 + nameSpace->_M_string_length);
  bVar3 = VRDataIndex::exists(config,(string *)local_3e8,&local_1e0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_3e8._0_8_ != pcVar1) {
    operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
  }
  if (bVar3) {
    local_300._0_8_ = local_300 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"HeadMatrix","");
    pcVar1 = (nameSpace->_M_dataplus)._M_p;
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_200,pcVar1,pcVar1 + nameSpace->_M_string_length);
    VVar4 = VRDataIndex::getValue(config,(string *)local_300,&local_200,true);
    VRMatrix4::VRMatrix4((VRMatrix4 *)local_3e8,VVar4);
    VRMatrix4::operator=((VRMatrix4 *)local_138,(VRMatrix4 *)local_3e8);
    VRMatrix4::~VRMatrix4((VRMatrix4 *)local_3e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
      operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
    }
  }
  else {
    local_3e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"LookAtUp","");
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    pcVar2 = (nameSpace->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar2,pcVar2 + nameSpace->_M_string_length);
    bVar3 = VRDataIndex::exists(config,(string *)local_3e8,&local_320,true);
    if (bVar3) {
      local_300._0_8_ = local_300 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"LookAtEye","");
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      pcVar2 = (nameSpace->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_340,pcVar2,pcVar2 + nameSpace->_M_string_length);
      bVar3 = VRDataIndex::exists(config,(string *)local_300,&local_340,true);
      if (bVar3) {
        local_180._0_8_ = local_180 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"LookAtCenter","");
        pcVar2 = (nameSpace->_M_dataplus)._M_p;
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_220,pcVar2,pcVar2 + nameSpace->_M_string_length);
        bVar3 = VRDataIndex::exists(config,(string *)local_180,&local_220,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
          operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
        }
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
        operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_3e8._0_8_ != pcVar1) {
      operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
    }
    if (bVar3 == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning : no HeadMatrix defined for ",0x24);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(nameSpace->_M_dataplus)._M_p,
                          nameSpace->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter",0x40);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
      std::ostream::put('\b');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Using IdentityMatrix as default 1,0,0,0, 0,1,0,0, 0,0,1,0, 0,0,0,1 ",0x43);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
      std::ostream::put('\b');
      std::ostream::flush();
    }
    else {
      local_3e8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"LookAtUp","");
      pcVar2 = (nameSpace->_M_dataplus)._M_p;
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,pcVar2,pcVar2 + nameSpace->_M_string_length);
      VVar4 = VRDataIndex::getValue(config,(string *)local_3e8,&local_240,true);
      VRVector3::VRVector3(&local_d8,VVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_3e8._0_8_ != pcVar1) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      local_3e8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"LookAtEye","");
      pcVar2 = (nameSpace->_M_dataplus)._M_p;
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_260,pcVar2,pcVar2 + nameSpace->_M_string_length);
      VVar4 = VRDataIndex::getValue(config,(string *)local_3e8,&local_260,true);
      VRVector3::VRVector3(&local_358,VVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_3e8._0_8_ != pcVar1) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      local_3e8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"LookAtCenter","");
      pcVar2 = (nameSpace->_M_dataplus)._M_p;
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_280,pcVar2,pcVar2 + nameSpace->_M_string_length);
      VVar4 = VRDataIndex::getValue(config,(string *)local_3e8,&local_280,true);
      VRVector3::VRVector3(&local_f0,VVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_3e8._0_8_ != pcVar1) {
        operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
      }
      operator-(&local_388,&local_358,&local_f0);
      VRVector3::normalize((VRVector3 *)local_3e8,&local_388);
      VRVector3::operator=(&local_388,(VRVector3 *)local_3e8);
      VRVector3::~VRVector3((VRVector3 *)local_3e8);
      VRVector3::cross(&local_370,&local_d8,&local_388);
      VRVector3::normalize((VRVector3 *)local_3e8,&local_370);
      VRVector3::operator=(&local_370,(VRVector3 *)local_3e8);
      VRVector3::~VRVector3((VRVector3 *)local_3e8);
      VRVector3::cross(&local_298,&local_388,&local_370);
      pfVar5 = VRVector3::operator[](&local_370,0);
      local_2a8._0_4_ = *pfVar5;
      pfVar5 = VRVector3::operator[](&local_298,0);
      local_2b8._0_4_ = *pfVar5;
      pfVar5 = VRVector3::operator[](&local_388,0);
      local_38c = *pfVar5;
      pfVar5 = VRVector3::operator[](&local_370,1);
      local_390 = *pfVar5;
      pfVar5 = VRVector3::operator[](&local_298,1);
      local_394 = *pfVar5;
      pfVar5 = VRVector3::operator[](&local_388,1);
      local_398 = *pfVar5;
      pfVar5 = VRVector3::operator[](&local_370,2);
      local_39c = *pfVar5;
      pfVar5 = VRVector3::operator[](&local_298,2);
      local_3a0 = *pfVar5;
      pfVar5 = VRVector3::operator[](&local_388,2);
      VRMatrix4::fromRowMajorElements
                ((VRMatrix4 *)local_3e8,(float)local_2a8._0_4_,(float)local_2b8._0_4_,local_38c,0.0,
                 local_390,local_394,local_398,0.0,local_39c,local_3a0,*pfVar5,0.0,0.0,0.0,0.0,1.0);
      pfVar5 = VRVector3::operator[](&local_358,0);
      local_2a8 = ZEXT416((uint)*pfVar5);
      pfVar5 = VRVector3::operator[](&local_358,1);
      local_2b8 = ZEXT416((uint)*pfVar5);
      pfVar5 = VRVector3::operator[](&local_358,2);
      VRMatrix4::fromRowMajorElements
                ((VRMatrix4 *)local_300,1.0,0.0,0.0,-(float)local_2a8._0_4_,0.0,1.0,0.0,
                 -(float)local_2b8._0_4_,0.0,0.0,1.0,-*pfVar5,0.0,0.0,0.0,1.0);
      operator*((VRMatrix4 *)local_180,(VRMatrix4 *)local_3e8,(VRMatrix4 *)local_300);
      VRMatrix4::inverse(&local_78,(VRMatrix4 *)local_180);
      VRMatrix4::operator=((VRMatrix4 *)local_138,&local_78);
      VRMatrix4::~VRMatrix4(&local_78);
      VRMatrix4::~VRMatrix4((VRMatrix4 *)local_180);
      VRMatrix4::~VRMatrix4((VRMatrix4 *)local_300);
      VRMatrix4::~VRMatrix4((VRMatrix4 *)local_3e8);
      VRVector3::~VRVector3(&local_298);
      VRVector3::~VRVector3(&local_370);
      VRVector3::~VRVector3(&local_388);
      VRVector3::~VRVector3(&local_f0);
      VRVector3::~VRVector3(&local_358);
      VRVector3::~VRVector3(&local_d8);
    }
  }
  this = (VRHeadTrackingNode *)operator_new(0xe0);
  VRMatrix4::VRMatrix4(&local_c0,(VRMatrix4 *)local_138);
  VRHeadTrackingNode(this,nameSpace,&local_1a0,&local_c0);
  VRMatrix4::~VRMatrix4(&local_c0);
  (**vrMain->_vptr_VRMainInterface)(vrMain,&this->super_VREventHandler);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  return &this->super_VRDisplayNode;
}

Assistant:

VRDisplayNode* VRHeadTrackingNode::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace) {

	std::string trackingEvent = config->getValue("HeadTrackingEvent", nameSpace);
	VRMatrix4 headMatrix;

	if (config->exists("HeadMatrix", nameSpace)){
		headMatrix = config->getValue("HeadMatrix", nameSpace);
	}
	else if (config->exists("LookAtUp", nameSpace) && config->exists("LookAtEye", nameSpace) && config->exists("LookAtCenter", nameSpace))
	{
		VRVector3 up = config->getValue("LookAtUp", nameSpace);
		VRVector3 eye = config->getValue("LookAtEye", nameSpace);
		VRVector3 center = config->getValue("LookAtCenter", nameSpace);

        VRVector3 z = eye - center;
		z = z.normalize();
		VRVector3 x = up.cross(z);
		x = x.normalize();
		VRVector3 y = z.cross(x);

        VRMatrix4 M1 = VRMatrix4::fromRowMajorElements(x[0], y[0], z[0], 0,
                                                       x[1], y[1], z[1], 0,
                                                       x[2], y[2], z[2], 0,
                                                       0, 0, 0, 1);

        VRMatrix4 M2 = VRMatrix4::fromRowMajorElements(1, 0, 0, -eye[0],
                                                       0, 1, 0, -eye[1],
                                                       0, 0, 1, -eye[2],
                                                       0, 0, 0, 1);

		VRMatrix4 lookAtMatrix = M1 * M2;
        headMatrix = lookAtMatrix.inverse();
	}
	else
	{
		std::cerr << "Warning : no HeadMatrix defined for " << nameSpace << std::endl;
		std::cerr << "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter" << std::endl;
		std::cerr << "Using IdentityMatrix as default 1,0,0,0, 0,1,0,0, 0,0,1,0, 0,0,0,1 " << std::endl;
	}

	VRHeadTrackingNode *node = new VRHeadTrackingNode(nameSpace, trackingEvent, headMatrix);

	vrMain->addEventHandler(node);

	return node;
}